

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astSwitchNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  size_t i;
  sysbvm_tuple_t sVar3;
  long lVar4;
  sysbvm_tuple_t slotCount;
  sysbvm_tuple_t local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_tuple_t sStack_60;
  sysbvm_tuple_t local_58;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *local_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_68 = 0;
  sStack_60 = 0;
  local_78 = 0;
  sStack_70 = 0;
  local_88 = 0;
  sStack_80 = 0;
  local_58 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 7;
  local_30 = (undefined1 *)&local_88;
  sysbvm_stackFrame_pushRecord(&local_48);
  local_78 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                       (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                        *(sysbvm_tuple_t *)(*arguments + 0x28));
  uVar1 = *(ulong *)(*arguments + 0x30);
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    slotCount = (sysbvm_tuple_t)(*(uint *)(uVar1 + 0xc) >> 3);
  }
  else {
    slotCount = 0;
  }
  sStack_70 = sysbvm_array_create(context,slotCount);
  local_68 = sysbvm_array_create(context,slotCount);
  for (sVar3 = 0; slotCount != sVar3; sVar3 = sVar3 + 1) {
    sVar2 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                      (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                       *(sysbvm_tuple_t *)
                        (*(long *)(*(long *)(*arguments + 0x30) + 0x10 + sVar3 * 8) + 0x28));
    if ((sStack_70 & 0xf) == 0 && sStack_70 != 0) {
      *(sysbvm_tuple_t *)(sStack_70 + 0x10 + sVar3 * 8) = sVar2;
    }
    sVar2 = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
    if ((local_68 & 0xf) == 0 && local_68 != 0) {
      *(sysbvm_tuple_t *)(local_68 + 0x10 + sVar3 * 8) = sVar2;
    }
  }
  sStack_60 = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
  local_88 = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
  sysbvm_functionBytecodeAssembler_caseJump
            (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),local_78,
             sStack_70,local_68,sStack_60);
  sStack_80 = sysbvm_functionBytecodeAssembler_newTemporary
                        (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
                         *(sysbvm_tuple_t *)(*arguments + 0x20));
  for (sVar3 = 0; slotCount != sVar3; sVar3 = sVar3 + 1) {
    uVar1 = *(ulong *)(*arguments + 0x30);
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      lVar4 = *(long *)(uVar1 + 0x10 + sVar3 * 8);
    }
    else {
      lVar4 = 0;
    }
    if ((local_68 & 0xf) == 0 && local_68 != 0) {
      sVar2 = *(sysbvm_tuple_t *)(local_68 + 0x10 + sVar3 * 8);
    }
    else {
      sVar2 = 0;
    }
    sysbvm_functionBytecodeAssembler_addInstruction
              (*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),sVar2);
    sVar2 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                      (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                       *(sysbvm_tuple_t *)(lVar4 + 0x30));
    sysbvm_functionBytecodeAssembler_move
              (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),sStack_80,sVar2
              );
    sysbvm_functionBytecodeAssembler_jump
              (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),local_88);
  }
  sysbvm_functionBytecodeAssembler_addInstruction
            (*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),sStack_60);
  if (*(sysbvm_tuple_t *)(*arguments + 0x38) == 0) {
    local_58 = sysbvm_functionBytecodeAssembler_addLiteral
                         (context,((sysbvm_functionBytecodeDirectCompiler_t *)arguments[1])->
                                  assembler,0);
  }
  else {
    local_58 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                         (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                          *(sysbvm_tuple_t *)(*arguments + 0x38));
  }
  sysbvm_functionBytecodeAssembler_move
            (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),sStack_80,
             local_58);
  sysbvm_functionBytecodeAssembler_addInstruction
            (*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),local_88);
  return sStack_80;
}

Assistant:

static sysbvm_tuple_t sysbvm_astSwitchNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astSwitchNode_t **switchNode = (sysbvm_astSwitchNode_t**)node;
    struct {
        sysbvm_tuple_t mergeLabel;
        sysbvm_tuple_t result;
        sysbvm_tuple_t value;
        sysbvm_tuple_t keyList;
        sysbvm_tuple_t caseLabelList;
        sysbvm_tuple_t defaultLabel;
        sysbvm_tuple_t defaultResult;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    // Emit the value.
    gcFrame.value = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*switchNode)->expression);

    // Emit the keys.
    size_t caseCount = sysbvm_array_getSize((*switchNode)->caseExpressions);
    gcFrame.keyList = sysbvm_array_create(context, caseCount);
    gcFrame.caseLabelList = sysbvm_array_create(context, caseCount);
    for(size_t i = 0; i < caseCount; ++i)
    {
        sysbvm_astCaseNode_t *caseNode = (sysbvm_astCaseNode_t*)sysbvm_array_at((*switchNode)->caseExpressions, i);
        sysbvm_tuple_t caseKey = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, caseNode->keyExpression);
        sysbvm_array_atPut(gcFrame.keyList, i, caseKey);

        sysbvm_tuple_t caseLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
        sysbvm_array_atPut(gcFrame.caseLabelList, i, caseLabel);
    }

    gcFrame.defaultLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
    gcFrame.mergeLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);

    // Emit the switch.
    sysbvm_functionBytecodeAssembler_caseJump(context, (*compiler)->assembler, gcFrame.value, gcFrame.keyList, gcFrame.caseLabelList, gcFrame.defaultLabel);

    gcFrame.result = sysbvm_functionBytecodeAssembler_newTemporary(context, (*compiler)->assembler, (*switchNode)->super.analyzedType);

    // Emit the different cases.
    for(size_t i = 0; i < caseCount; ++i)
    {
        sysbvm_astCaseNode_t *caseNode = (sysbvm_astCaseNode_t*)sysbvm_array_at((*switchNode)->caseExpressions, i);
        sysbvm_tuple_t caseLabel = sysbvm_array_at(gcFrame.caseLabelList, i);
        sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, caseLabel);

        sysbvm_tuple_t caseValue = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, caseNode->valueExpression);
        sysbvm_functionBytecodeAssembler_move(context, (*compiler)->assembler, gcFrame.result, caseValue);
        sysbvm_functionBytecodeAssembler_jump(context, (*compiler)->assembler, gcFrame.mergeLabel);
    }

    // Emit the default case.
    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.defaultLabel);
    if((*switchNode)->defaultExpression)
        gcFrame.defaultResult = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*switchNode)->defaultExpression);
    else
        gcFrame.defaultResult = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_NULL_TUPLE);
    sysbvm_functionBytecodeAssembler_move(context, (*compiler)->assembler, gcFrame.result, gcFrame.defaultResult);

    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.mergeLabel);
    return gcFrame.result;
}